

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>
::val(FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>
      *this)

{
  double dVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
  *pFVar4;
  value_type vVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  vVar5 = FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>
          ::val(&this->left_->fadexpr_);
  dVar1 = (this->right_->fadexpr_).left_.constant_;
  pFVar2 = (this->right_->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  dVar6 = cos((((((pFVar3->fadexpr_).left_)->fadexpr_).expr_)->fadexpr_).expr_.val_);
  dVar7 = cos((((pFVar3->fadexpr_).right_)->fadexpr_).expr_.val_);
  pFVar4 = (pFVar2->fadexpr_).right_;
  dVar8 = sin((((pFVar4->fadexpr_).left_)->fadexpr_).expr_.val_);
  dVar9 = sin((((pFVar4->fadexpr_).right_)->fadexpr_).expr_.val_);
  return (dVar9 * dVar8 - dVar7 * dVar6) * dVar1 + vVar5;
}

Assistant:

const value_type val() const {return left_.val() + right_.val();}